

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImGuiWindow *pIVar6;
  ImGuiGroupData *pIVar7;
  ImGuiContext *pIVar8;
  char cVar9;
  ulong uVar10;
  ImGuiID IVar11;
  bool bVar12;
  ImGuiContext *g;
  uint uVar13;
  uint uVar14;
  float fVar15;
  ImVec2 IVar16;
  ImRect group_bb;
  ImRect local_40;
  ImVec2 local_30;
  
  pIVar8 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  pIVar6->WriteAccessed = true;
  uVar14 = (pIVar6->DC).GroupStack.Size;
  uVar10 = (ulong)uVar14;
  if (uVar10 == 0) {
    __assert_fail("!window->DC.GroupStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x1c38,"void ImGui::EndGroup()");
  }
  if ((int)uVar14 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                  ,0x534,"T &ImVector<ImGuiGroupData>::back() [T = ImGuiGroupData]");
  }
  pIVar7 = (pIVar6->DC).GroupStack.Data;
  fVar2 = pIVar7[uVar10 - 1].BackupCursorPos.x;
  fVar3 = pIVar7[uVar10 - 1].BackupCursorPos.y;
  fVar4 = (pIVar6->DC).CursorMaxPos.x;
  fVar5 = (pIVar6->DC).CursorMaxPos.y;
  uVar13 = -(uint)(fVar2 <= fVar4);
  local_40.Max.x = (float)(uVar13 & (uint)fVar4 | ~uVar13 & (uint)fVar2);
  uVar13 = -(uint)(fVar3 <= fVar5);
  fVar15 = (float)(uVar13 & (uint)fVar5 | ~uVar13 & (uint)fVar3);
  local_40.Max.y = fVar15;
  local_40.Min = pIVar7[uVar10 - 1].BackupCursorPos;
  (pIVar6->DC).CursorPos = local_40.Min;
  fVar2 = pIVar7[uVar10 - 1].BackupCursorMaxPos.x;
  fVar3 = pIVar7[uVar10 - 1].BackupCursorMaxPos.y;
  uVar13 = -(uint)(fVar4 <= fVar2);
  IVar16.x = (float)(~uVar13 & (uint)fVar4 | (uint)fVar2 & uVar13);
  uVar13 = -(uint)(fVar5 <= fVar3);
  IVar16.y = (float)(~uVar13 & (uint)fVar5 | (uint)fVar3 & uVar13);
  (pIVar6->DC).CursorMaxPos = IVar16;
  (pIVar6->DC).Indent.x = pIVar7[uVar10 - 1].BackupIndent.x;
  (pIVar6->DC).GroupOffset.x = pIVar7[uVar10 - 1].BackupGroupOffset.x;
  (pIVar6->DC).CurrLineSize = pIVar7[uVar10 - 1].BackupCurrLineSize;
  fVar2 = pIVar7[uVar10 - 1].BackupCurrLineTextBaseOffset;
  (pIVar6->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar8->LogEnabled == true) {
    pIVar8->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar7[uVar10 - 1].EmitItem != true) goto LAB_00160c0f;
  fVar3 = (pIVar6->DC).PrevLineTextBaseOffset;
  uVar14 = -(uint)(fVar2 <= fVar3);
  (pIVar6->DC).CurrLineTextBaseOffset = (float)(~uVar14 & (uint)fVar2 | (uint)fVar3 & uVar14);
  local_30.y = fVar15 - local_40.Min.y;
  local_30.x = local_40.Max.x - local_40.Min.x;
  ItemSize(&local_30,-1.0);
  bVar12 = false;
  ItemAdd(&local_40,0,(ImRect *)0x0);
  IVar11 = pIVar8->ActiveId;
  if (pIVar7[uVar10 - 1].BackupActiveIdIsAlive != IVar11) {
    bVar12 = IVar11 != 0 && pIVar8->ActiveIdIsAlive == IVar11;
  }
  if (pIVar7[uVar10 - 1].BackupActiveIdPreviousFrameIsAlive == false) {
    cVar9 = pIVar8->ActiveIdPreviousFrameIsAlive;
  }
  else {
    cVar9 = '\0';
  }
  if (bVar12) {
LAB_00160ba8:
    (pIVar6->DC).LastItemId = IVar11;
  }
  else if (cVar9 != '\0') {
    IVar11 = pIVar8->ActiveIdPreviousFrame;
    goto LAB_00160ba8;
  }
  (pIVar6->DC).LastItemRect.Min = local_40.Min;
  (pIVar6->DC).LastItemRect.Max = local_40.Max;
  if ((bVar12) && (pIVar8->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar6->DC).LastItemStatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar14 = (pIVar6->DC).LastItemStatusFlags;
  (pIVar6->DC).LastItemStatusFlags = uVar14 | 0x20;
  if ((cVar9 != '\0') && (pIVar8->ActiveId != pIVar8->ActiveIdPreviousFrame)) {
    (pIVar6->DC).LastItemStatusFlags = uVar14 | 0x60;
  }
  uVar14 = (pIVar6->DC).GroupStack.Size;
  if ((int)uVar14 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                  ,0x540,"void ImVector<ImGuiGroupData>::pop_back() [T = ImGuiGroupData]");
  }
LAB_00160c0f:
  (pIVar6->DC).GroupStack.Size = uVar14 - 1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());  // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return

    if (!group_data.EmitItem)
    {
        window->DC.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The tests not symmetrical because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = !group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive;
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    window->DC.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}